

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notification.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::Notification::WaitForNotificationWithDeadline(Notification *this,Time deadline)

{
  bool bVar1;
  code *local_40;
  char local_38 [8];
  code *local_30;
  atomic<bool> *local_28;
  
  AbslInternalTraceWait_lts_20250127(this,kNotification);
  bVar1 = true;
  if (((this->notified_yet_)._M_base._M_i & 1U) == 0) {
    local_28 = &this->notified_yet_;
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_30 = Condition::CastAndCallFunction<std::atomic<bool>const>;
    local_40 = HasBeenNotifiedInternal;
    bVar1 = Mutex::LockWhenWithDeadline(&this->mutex_,(Condition *)&local_40,deadline);
    Mutex::Unlock(&this->mutex_);
    if (!bVar1) {
      this = (Notification *)0x0;
    }
  }
  AbslInternalTraceContinue_lts_20250127(this,kNotification);
  return bVar1;
}

Assistant:

bool Notification::WaitForNotificationWithDeadline(absl::Time deadline) const {
  base_internal::TraceWait(this, TraceObjectKind());
  bool notified = HasBeenNotifiedInternal(&this->notified_yet_);
  if (!notified) {
    notified = this->mutex_.LockWhenWithDeadline(
        Condition(&HasBeenNotifiedInternal, &this->notified_yet_), deadline);
    this->mutex_.Unlock();
  }
  base_internal::TraceContinue(notified ? this : nullptr, TraceObjectKind());
  return notified;
}